

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Reindex(Parse *pParse,Token *pName1,Token *pName2)

{
  int iVar1;
  char *zName;
  char *zColl;
  Token *pObjName;
  sqlite3 *db;
  Index *pIStack_48;
  int iDb;
  Index *pIndex;
  Table *pTab;
  char *zDb;
  char *z;
  CollSeq *pColl;
  Token *pName2_local;
  Token *pName1_local;
  Parse *pParse_local;
  
  pObjName = (Token *)pParse->db;
  pColl = (CollSeq *)pName2;
  pName2_local = pName1;
  pName1_local = (Token *)pParse;
  iVar1 = sqlite3ReadSchema(pParse);
  if (iVar1 == 0) {
    if (pName2_local == (Token *)0x0) {
      reindexDatabases((Parse *)pName1_local,(char *)0x0);
    }
    else {
      if ((pColl == (CollSeq *)0x0) || (pColl->zName == (char *)0x0)) {
        zName = sqlite3NameFromToken((sqlite3 *)pName1_local->z,pName2_local);
        if (zName == (char *)0x0) {
          return;
        }
        z = (char *)sqlite3FindCollSeq((sqlite3 *)pObjName,*(u8 *)((long)&pObjName[5].z + 2),zName,0
                                      );
        if ((CollSeq *)z != (CollSeq *)0x0) {
          reindexDatabases((Parse *)pName1_local,zName);
          sqlite3DbFree((sqlite3 *)pObjName,zName);
          return;
        }
        sqlite3DbFree((sqlite3 *)pObjName,zName);
      }
      db._4_4_ = sqlite3TwoPartName((Parse *)pName1_local,pName2_local,(Token *)pColl,
                                    (Token **)&zColl);
      if ((-1 < db._4_4_) &&
         (zDb = sqlite3NameFromToken((sqlite3 *)pObjName,(Token *)zColl), zDb != (char *)0x0)) {
        pTab = *(Table **)(pObjName[2].z + (long)db._4_4_ * 0x20);
        pIndex = (Index *)sqlite3FindTable((sqlite3 *)pObjName,zDb,(char *)pTab);
        if ((Table *)pIndex == (Table *)0x0) {
          pIStack_48 = sqlite3FindIndex((sqlite3 *)pObjName,zDb,(char *)pTab);
          sqlite3DbFree((sqlite3 *)pObjName,zDb);
          if (pIStack_48 == (Index *)0x0) {
            sqlite3ErrorMsg((Parse *)pName1_local,"unable to identify the object to be reindexed");
          }
          else {
            sqlite3BeginWriteOperation((Parse *)pName1_local,0,db._4_4_);
            sqlite3RefillIndex((Parse *)pName1_local,pIStack_48,-1);
          }
        }
        else {
          reindexTable((Parse *)pName1_local,(Table *)pIndex,(char *)0x0);
          sqlite3DbFree((sqlite3 *)pObjName,zDb);
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Reindex(Parse *pParse, Token *pName1, Token *pName2){
  CollSeq *pColl;             /* Collating sequence to be reindexed, or NULL */
  char *z;                    /* Name of a table or index */
  const char *zDb;            /* Name of the database */
  Table *pTab;                /* A table in the database */
  Index *pIndex;              /* An index associated with pTab */
  int iDb;                    /* The database index number */
  sqlite3 *db = pParse->db;   /* The database connection */
  Token *pObjName;            /* Name of the table or index to be reindexed */

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    return;
  }

  if( pName1==0 ){
    reindexDatabases(pParse, 0);
    return;
  }else if( NEVER(pName2==0) || pName2->z==0 ){
    char *zColl;
    assert( pName1->z );
    zColl = sqlite3NameFromToken(pParse->db, pName1);
    if( !zColl ) return;
    pColl = sqlite3FindCollSeq(db, ENC(db), zColl, 0);
    if( pColl ){
      reindexDatabases(pParse, zColl);
      sqlite3DbFree(db, zColl);
      return;
    }
    sqlite3DbFree(db, zColl);
  }
  iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pObjName);
  if( iDb<0 ) return;
  z = sqlite3NameFromToken(db, pObjName);
  if( z==0 ) return;
  zDb = db->aDb[iDb].zDbSName;
  pTab = sqlite3FindTable(db, z, zDb);
  if( pTab ){
    reindexTable(pParse, pTab, 0);
    sqlite3DbFree(db, z);
    return;
  }
  pIndex = sqlite3FindIndex(db, z, zDb);
  sqlite3DbFree(db, z);
  if( pIndex ){
    sqlite3BeginWriteOperation(pParse, 0, iDb);
    sqlite3RefillIndex(pParse, pIndex, -1);
    return;
  }
  sqlite3ErrorMsg(pParse, "unable to identify the object to be reindexed");
}